

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseCatchExprList(WastParser *this,CatchVector *catches)

{
  Var *this_00;
  Expr *pEVar1;
  Expr *pEVar2;
  bool bVar3;
  Result RVar4;
  TokenType TVar5;
  bool bVar6;
  Token token;
  Token local_f8;
  Catch local_b8;
  
  this_00 = &local_b8.var;
  bVar6 = false;
  do {
    GetToken(&local_f8,this);
    Var::Var(this_00);
    local_b8.exprs.first_ = (Expr *)0x0;
    local_b8.exprs.last_ = (Expr *)0x0;
    local_b8.exprs.size_ = 0;
    Consume(&local_f8,this);
    if (local_f8.token_type_ == Catch) {
      RVar4 = ParseVar(this,this_00);
      bVar3 = bVar6;
      if (RVar4.enum_ == Error) {
        bVar3 = false;
        pEVar2 = local_b8.exprs.first_;
      }
      else {
LAB_00142192:
        RVar4 = ParseTerminatingInstrList(this,&local_b8.exprs);
        bVar6 = bVar3;
        if ((RVar4.enum_ == Error) || (RVar4 = Expect(this,Rpar), RVar4.enum_ == Error)) {
          bVar3 = false;
          pEVar2 = local_b8.exprs.first_;
        }
        else {
          std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                    (catches,&local_b8);
          bVar3 = true;
          pEVar2 = local_b8.exprs.first_;
        }
      }
    }
    else {
      bVar3 = true;
      if (!bVar6) goto LAB_00142192;
      bVar3 = false;
      Error(this,0x19a548);
      pEVar2 = local_b8.exprs.first_;
    }
    while (pEVar2 != (Expr *)0x0) {
      pEVar1 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
      (*pEVar2->_vptr_Expr[1])();
      pEVar2 = pEVar1;
    }
    local_b8.exprs.first_ = (Expr *)0x0;
    local_b8.exprs.last_ = (Expr *)0x0;
    local_b8.exprs.size_ = 0;
    Var::~Var(this_00);
    if (!bVar3) {
      return (Result)Error;
    }
    bVar3 = Match(this,Lpar);
    if (!bVar3) {
      return (Result)Ok;
    }
    TVar5 = Peek(this,0);
    if (1 < TVar5 - Catch) {
      return (Result)Ok;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCatchExprList(CatchVector* catches) {
  WABT_TRACE(ParseCatchExprList);
  bool parsedCatchAll = false;

  do {
    Catch catch_(GetLocation());

    auto token = Consume();
    if (token.token_type() == TokenType::Catch) {
      CHECK_RESULT(ParseVar(&catch_.var));
    } else {
      if (parsedCatchAll) {
        Error(token.loc, "multiple catch_all clauses not allowed");
        return Result::Error;
      }
      parsedCatchAll = true;
    }

    CHECK_RESULT(ParseTerminatingInstrList(&catch_.exprs));
    EXPECT(Rpar);
    catches->push_back(std::move(catch_));
  } while (Match(TokenType::Lpar) && IsCatch(Peek()));

  return Result::Ok;
}